

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O2

void maxHeapify(HighsInt *heap_v,HighsInt *heap_i,HighsInt i,HighsInt n)

{
  int iVar1;
  HighsInt HVar2;
  uint uVar3;
  
  iVar1 = heap_v[i];
  HVar2 = heap_i[i];
  while (uVar3 = i * 2, i = uVar3, (int)uVar3 <= n) {
    if (((int)uVar3 < n) && (i = uVar3 | 1, heap_v[(int)(uVar3 | 1)] <= heap_v[(int)uVar3])) {
      i = uVar3;
    }
    if (heap_v[i] < iVar1) break;
    heap_v[i / 2] = heap_v[i];
    heap_i[i / 2] = heap_i[i];
  }
  heap_v[i / 2] = iVar1;
  heap_i[i / 2] = HVar2;
  return;
}

Assistant:

void maxHeapify(HighsInt* heap_v, HighsInt* heap_i, HighsInt i, HighsInt n) {
  HighsInt temp_v;
  HighsInt j, temp_i;
  temp_v = heap_v[i];
  temp_i = heap_i[i];
  j = 2 * i;
  while (j <= n) {
    if (j < n && heap_v[j + 1] > heap_v[j]) j = j + 1;
    if (temp_v > heap_v[j])
      break;
    else if (temp_v <= heap_v[j]) {
      heap_v[j / 2] = heap_v[j];
      heap_i[j / 2] = heap_i[j];
      j = 2 * j;
    }
  }
  heap_v[j / 2] = temp_v;
  heap_i[j / 2] = temp_i;
  return;
}